

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

ssize_t __thiscall
capnp::_::anon_unknown_0::TestNetworkAdapter::ConnectionImpl::OutgoingRpcMessageImpl::send
          (OutgoingRpcMessageImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint *puVar1;
  TaskSet *this_00;
  ArrayPtr<const_capnp::word> array;
  word *pwVar2;
  size_t sVar3;
  PromiseNode *pPVar4;
  int iVar5;
  PromiseNode *pPVar6;
  TransformPromiseNodeBase *this_01;
  ConnectionImpl *extraout_RAX;
  undefined4 extraout_var;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar8;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ReaderOptions options;
  Array<capnp::word> local_68;
  Own<kj::_::PromiseNode> local_48;
  ArrayDisposer *local_38;
  ConnectionImpl *pCVar7;
  
  pCVar7 = this->connection;
  if ((pCVar7->networkException).ptr.isSet == false) {
    puVar1 = &pCVar7->network->sent;
    *puVar1 = *puVar1 + 1;
    AVar8 = MessageBuilder::getSegmentsForOutput(&(this->message).super_MessageBuilder);
    segments.ptr = (ArrayPtr<const_capnp::word> *)AVar8.size_;
    segments.size_ = __n;
    messageToFlatArray(&local_68,(capnp *)AVar8.ptr,segments);
    pPVar6 = (PromiseNode *)operator_new(0x138);
    sVar3 = local_68.size_;
    pwVar2 = local_68.ptr;
    array.size_ = local_68.size_;
    array.ptr = local_68.ptr;
    local_38 = local_68.disposer;
    local_68.ptr = (word *)0x0;
    local_68.size_ = 0;
    *(undefined4 *)&pPVar6[2]._vptr_PromiseNode = 0;
    pPVar6->_vptr_PromiseNode = (_func_int **)&PTR_getBody_0060d6a0;
    pPVar6[1]._vptr_PromiseNode = (_func_int **)&PTR_disposeImpl_0060d6c8;
    pPVar6[3]._vptr_PromiseNode = (_func_int **)pwVar2;
    pPVar6[4]._vptr_PromiseNode = (_func_int **)sVar3;
    pPVar6[5]._vptr_PromiseNode = (_func_int **)local_68.disposer;
    local_48.disposer = (Disposer *)0x0;
    local_48.ptr = (PromiseNode *)0x0;
    options._8_8_ = 0x40;
    options.traversalLimitInWords = 0x800000;
    UnalignedFlatArrayMessageReader::UnalignedFlatArrayMessageReader
              ((UnalignedFlatArrayMessageReader *)(pPVar6 + 6),array,options);
    sVar3 = local_68.size_;
    pwVar2 = local_68.ptr;
    (((UnalignedFlatArrayMessageReader *)(pPVar6 + 6))->super_MessageReader)._vptr_MessageReader =
         (_func_int **)&PTR__UnalignedFlatArrayMessageReader_0060f958;
    if (local_68.ptr != (word *)0x0) {
      local_68.ptr = (word *)0x0;
      local_68.size_ = 0;
      (**(local_68.disposer)->_vptr_ArrayDisposer)(local_68.disposer,pwVar2,8,sVar3,sVar3,0);
    }
    pCVar7 = this->connection;
    this_00 = (pCVar7->tasks).ptr;
    kj::_::yield();
    this_01 = (TransformPromiseNodeBase *)operator_new(0x40);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_01,&local_48,
               kj::
               CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:280:13),_kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>_>
               ::operator()<>);
    pPVar4 = local_48.ptr;
    (this_01->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0060d760;
    this_01[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)pCVar7;
    this_01[1].dependency.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>
          ::instance;
    this_01[1].dependency.ptr = pPVar6;
    local_68.ptr = (word *)&kj::_::
                            HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::CaptureByMove<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::OutgoingRpcMessageImpl::send()::{lambda(kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>&&)#1},kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>>,kj::_::PropagateException>>
                            ::instance;
    local_68.size_ = (size_t)this_01;
    if (local_48.ptr != (PromiseNode *)0x0) {
      local_48.ptr = (PromiseNode *)0x0;
      (**(local_48.disposer)->_vptr_Disposer)
                (local_48.disposer,pPVar4->_vptr_PromiseNode[-2] + (long)&pPVar4->_vptr_PromiseNode)
      ;
    }
    kj::TaskSet::add(this_00,(Promise<void> *)&local_68);
    sVar3 = local_68.size_;
    pCVar7 = extraout_RAX;
    if ((TransformPromiseNodeBase *)local_68.size_ != (TransformPromiseNodeBase *)0x0) {
      local_68.size_ = 0;
      iVar5 = (**(code **)(local_68.ptr)->content)
                        (local_68.ptr,
                         ((PromiseNode *)sVar3)->_vptr_PromiseNode[-2] +
                         (long)&((PromiseNode *)sVar3)->_vptr_PromiseNode);
      pCVar7 = (ConnectionImpl *)CONCAT44(extraout_var,iVar5);
    }
  }
  return (ssize_t)pCVar7;
}

Assistant:

void send() override {
        if (connection.networkException != nullptr) {
          return;
        }

        ++connection.network.sent;

        // Uncomment to get a debug dump.
//        kj::String msg = connection.network.network.dumper.dump(
//            message.getRoot<rpc::Message>(), connection.sender);
//        KJ_ DBG(msg);

        auto incomingMessage = kj::heap<IncomingRpcMessageImpl>(messageToFlatArray(message));

        auto connectionPtr = &connection;
        connection.tasks->add(kj::evalLater(kj::mvCapture(incomingMessage,
            [connectionPtr](kj::Own<IncomingRpcMessageImpl>&& message) {
          KJ_IF_MAYBE(p, connectionPtr->partner) {
            if (p->fulfillers.empty()) {
              p->messages.push(kj::mv(message));
            } else {
              ++p->network.received;
              p->fulfillers.front()->fulfill(
                  kj::Own<IncomingRpcMessage>(kj::mv(message)));
              p->fulfillers.pop();
            }
          }
        })));
      }